

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Object::Object
          (Object *this,LocationRange *lr,Fodder *open_fodder,ObjectFields *fields,
          bool trailing_comma,Fodder *close_fodder)

{
  byte bVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_> *in_RCX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  AST *in_R9;
  bool bVar4;
  byte local_51;
  Fodder *in_stack_ffffffffffffffb8;
  ASTType in_stack_ffffffffffffffc4;
  LocationRange *in_stack_ffffffffffffffc8;
  
  bVar1 = in_R8B & 1;
  AST::AST(in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__Object_003a9cb0;
  std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  vector((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_> *)
         in_RSI,(vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                 *)in_RDX);
  *(byte *)(in_RDI + 0x13) = bVar1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_RSI,in_RDX);
  sVar2 = std::
          vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
          size(in_RCX);
  local_51 = 1;
  if (sVar2 == 0) {
    local_51 = bVar1 ^ 0xff;
  }
  if ((local_51 & 1) == 0) {
    __assert_fail("fields.size() > 0 || !trailing_comma",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x321,
                  "jsonnet::internal::Object::Object(const LocationRange &, const Fodder &, const ObjectFields &, bool, const Fodder &)"
                 );
  }
  sVar2 = std::
          vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
          size(in_RCX);
  if (sVar2 != 0) {
    bVar4 = true;
    if (bVar1 == 0) {
      sVar2 = std::
              vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              ::size(in_RCX);
      pvVar3 = std::
               vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
               ::operator[](in_RCX,sVar2 - 1);
      sVar2 = std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::size(&pvVar3->commaFodder);
      bVar4 = sVar2 == 0;
    }
    if (!bVar4) {
      __assert_fail("trailing_comma || fields[fields.size() - 1].commaFodder.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                    0x323,
                    "jsonnet::internal::Object::Object(const LocationRange &, const Fodder &, const ObjectFields &, bool, const Fodder &)"
                   );
    }
  }
  return;
}

Assistant:

Object(const LocationRange &lr, const Fodder &open_fodder, const ObjectFields &fields,
           bool trailing_comma, const Fodder &close_fodder)
        : AST(lr, AST_OBJECT, open_fodder),
          fields(fields),
          trailingComma(trailing_comma),
          closeFodder(close_fodder)
    {
        assert(fields.size() > 0 || !trailing_comma);
        if (fields.size() > 0)
            assert(trailing_comma || fields[fields.size() - 1].commaFodder.size() == 0);
    }